

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

string * local_to_utf8(string *str)

{
  string *in_RSI;
  string *str_local;
  string *out;
  
  std::__cxx11::string::string((string *)str);
  local_to_utf8(in_RSI,str);
  return str;
}

Assistant:

std::string local_to_utf8(const std::string& str)
{
    std::string out;
    local_to_utf8(str, &out);
    return out;
}